

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void * __thiscall asmjit::v1_14::Zone::_alloc(Zone *this,size_t size,size_t alignment)

{
  Block *this_00;
  void *pvVar1;
  uint8_t *puVar2;
  ulong in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  uint8_t *end;
  uint8_t *ptr;
  size_t realBlockSize;
  Block *newBlock;
  size_t finalBlockSize;
  size_t blockSizeOverhead;
  size_t alignmentOverhead;
  size_t defaultBlockSize;
  size_t defaultBlockSizeShift;
  uint8_t *end_1;
  uint8_t *ptr_1;
  size_t requiredBlockAlignment;
  size_t defaultBlockAlignment;
  Block *next;
  Block *curBlock;
  char *in_stack_000002c0;
  int in_stack_000002cc;
  char *in_stack_000002d0;
  ulong local_130;
  ulong local_120;
  ulong local_118;
  size_t local_e8;
  undefined8 local_d8;
  long local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  uint8_t *local_a8;
  void *local_a0;
  ulong local_98;
  ulong local_90;
  Block *local_88;
  Block *local_80;
  undefined1 local_78 [8];
  ulong local_70;
  void *local_60;
  ulong *local_50;
  undefined1 *local_48;
  ulong local_40;
  uint8_t *local_38;
  ulong local_30;
  uint8_t *local_28;
  undefined8 *local_20;
  ulong *local_18;
  ulong *local_10;
  ulong *local_8;
  
  local_80 = (Block *)in_RDI[2];
  local_88 = local_80->next;
  local_90 = 1L << ((byte)in_RDI[3] & 0x3f);
  local_48 = local_78;
  local_50 = &local_90;
  local_118 = in_RDX;
  if (in_RDX < local_90) {
    local_118 = local_90;
  }
  local_98 = local_118;
  local_70 = in_RSI;
  if (local_88 != (Block *)0x0) {
    local_28 = Block::data(local_88);
    local_30 = local_98;
    local_a0 = (void *)((ulong)(local_28 + (local_98 - 1)) & (local_98 - 1 ^ 0xffffffffffffffff));
    local_a8 = Block::data(local_88);
    local_a8 = local_a8 + local_88->size;
    if (local_70 <= (ulong)((long)local_a8 - (long)local_a0)) {
      in_RDI[2] = (ulong)local_88;
      *in_RDI = (long)local_a0 + local_70;
      in_RDI[1] = (ulong)local_a8;
      return local_a0;
    }
  }
  local_b8 = in_RDI[4] + (ulong)*(byte *)((long)in_RDI + 0x19);
  local_c0 = (ulong)*(byte *)((long)in_RDI + 0x1a);
  local_8 = &local_b8;
  local_10 = &local_c0;
  local_120 = local_b8;
  if (local_c0 < local_b8) {
    local_120 = local_c0;
  }
  local_b0 = local_120;
  local_c8 = 1L << ((byte)local_120 & 0x3f);
  local_d8 = 8;
  local_18 = &local_98;
  local_20 = &local_d8;
  if (local_98 < 9) {
    local_130 = local_98;
  }
  else {
    local_130 = 8;
  }
  local_d0 = local_98 - local_130;
  if ((ulong)(local_c8 - (local_d0 + 0x38)) < local_70) {
    if (-(local_d0 + 0x38) - 1U < local_70) {
      return (void *)0x0;
    }
    local_e8 = local_70 + local_d0 + 0x18;
  }
  else {
    local_e8 = local_c8 - 0x20;
  }
  this_00 = (Block *)malloc(local_e8);
  if (this_00 == (Block *)0x0) {
    local_60 = (void *)0x0;
  }
  else {
    this_00->prev = (Block *)0x0;
    this_00->next = (Block *)0x0;
    this_00->size = local_e8 - 0x18;
    if (local_80 != (Block *)_zeroBlock) {
      this_00->prev = local_80;
      local_80->next = this_00;
      if (local_88 != (Block *)0x0) {
        this_00->next = local_88;
        local_88->prev = this_00;
      }
    }
    local_38 = Block::data(this_00);
    local_40 = local_98;
    pvVar1 = (void *)((ulong)(local_38 + (local_98 - 1)) & (local_98 - 1 ^ 0xffffffffffffffff));
    puVar2 = Block::data(this_00);
    *in_RDI = (long)pvVar1 + local_70;
    in_RDI[1] = (ulong)(puVar2 + (local_e8 - 0x18));
    in_RDI[2] = (ulong)this_00;
    in_RDI[4] = in_RDI[4] + 1;
    local_60 = pvVar1;
    if (in_RDI[1] < *in_RDI) {
      DebugUtils::assertionFailed(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
    }
  }
  return local_60;
}

Assistant:

void* Zone::_alloc(size_t size, size_t alignment) noexcept {
  Block* curBlock = _block;
  Block* next = curBlock->next;

  size_t defaultBlockAlignment = blockAlignment();
  size_t requiredBlockAlignment = Support::max<size_t>(alignment, defaultBlockAlignment);

  // If the `Zone` has been cleared the current block doesn't have to be the last one. Check if there is a block
  // that can be used instead of allocating a new one. If there is a `next` block it's completely unused, we don't
  // have to check for remaining bytes in that case.
  if (next) {
    uint8_t* ptr = Support::alignUp(next->data(), requiredBlockAlignment);
    uint8_t* end = next->data() + next->size;

    if (size <= (size_t)(end - ptr)) {
      _block = next;
      _ptr = ptr + size;
      _end = end;
      return static_cast<void*>(ptr);
    }
  }

  // Calculates the "default" size of a next block - in most cases this would be enough for the allocation. In
  // general we want to gradually increase block size when more and more blocks are allocated until the maximum
  // block size. Since we use shifts (aka log2(size) sizes) we just need block count and minumum/maximum block
  // size shift to calculate the final size.
  size_t defaultBlockSizeShift = Support::min<size_t>(_blockCount + _minimumBlockSizeShift, _maximumBlockSizeShift);
  size_t defaultBlockSize = size_t(1) << defaultBlockSizeShift;

  // Allocate a new block. We have to accommodate all possible overheads so after the memory is allocated and then
  // properly aligned there will be size for the requested memory. In 99.9999% cases this is never a problem, but
  // we must be sure that even rare border cases would allocate properly.
  size_t alignmentOverhead = requiredBlockAlignment - Support::min<size_t>(requiredBlockAlignment, Globals::kAllocAlignment);
  size_t blockSizeOverhead = kBlockSize + Globals::kAllocOverhead + alignmentOverhead;

  // If the requested size is larger than a default calculated block size -> increase block size so the allocation
  // would be enough to fit the requested size.
  size_t finalBlockSize = defaultBlockSize;

  if (ASMJIT_UNLIKELY(size > defaultBlockSize - blockSizeOverhead)) {
    if (ASMJIT_UNLIKELY(size > SIZE_MAX - blockSizeOverhead)) {
      // This would probably never happen in practice - however, it needs to be done to stop malicious cases like
      // `alloc(SIZE_MAX)`.
      return nullptr;
    }
    finalBlockSize = size + alignmentOverhead + kBlockSize;
  }
  else {
    finalBlockSize -= Globals::kAllocOverhead;
  }

  // Allocate new block.
  Block* newBlock = static_cast<Block*>(::malloc(finalBlockSize));

  if (ASMJIT_UNLIKELY(!newBlock)) {
    return nullptr;
  }

  // finalBlockSize includes the struct size, which must be avoided when assigning the size to a newly allocated block.
  size_t realBlockSize = finalBlockSize - kBlockSize;

  // Align the pointer to `minimumAlignment` and adjust the size of this block accordingly. It's the same as using
  // `minimumAlignment - Support::alignUpDiff()`, just written differently.
  newBlock->prev = nullptr;
  newBlock->next = nullptr;
  newBlock->size = realBlockSize;

  if (curBlock != &_zeroBlock) {
    newBlock->prev = curBlock;
    curBlock->next = newBlock;

    // Does only happen if there is a next block, but the requested memory can't fit into it. In this case a new
    // buffer is allocated and inserted between the current block and the next one.
    if (next) {
      newBlock->next = next;
      next->prev = newBlock;
    }
  }

  uint8_t* ptr = Support::alignUp(newBlock->data(), requiredBlockAlignment);
  uint8_t* end = newBlock->data() + realBlockSize;

  _ptr = ptr + size;
  _end = end;
  _block = newBlock;
  _blockCount++;

  ASMJIT_ASSERT(_ptr <= _end);
  return static_cast<void*>(ptr);
}